

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O0

void repeat(parse *p,sopno start,int from,int to)

{
  long finish_00;
  sopno sVar1;
  int local_3c;
  int local_34;
  sopno copy;
  sopno finish;
  int to_local;
  int from_local;
  sopno start_local;
  parse *p_local;
  
  finish_00 = p->slen;
  if (p->error == 0) {
    local_34 = from;
    if ((1 < from) && (local_34 = 2, from == 0x100)) {
      local_34 = 3;
    }
    local_3c = to;
    if ((1 < to) && (local_3c = 2, to == 0x100)) {
      local_3c = 3;
    }
    switch(local_34 * 8 + local_3c) {
    case 0:
      p->slen = p->slen - (finish_00 - start);
      break;
    case 1:
    case 2:
    case 3:
      doinsert(p,0x3c000000,(p->slen - start) + 1,start);
      repeat(p,start + 1,1,to);
      doemit(p,0x40000000,p->slen - start);
      dofwd(p,start,p->slen - start);
      doemit(p,0x44000000,0);
      dofwd(p,p->slen + -1,p->slen - (p->slen + -1));
      doemit(p,0x48000000,p->slen - (p->slen + -2));
      break;
    default:
      seterr(p,0xf);
      break;
    case 9:
      break;
    case 10:
      doinsert(p,0x3c000000,(p->slen - start) + 1,start);
      doemit(p,0x40000000,p->slen - start);
      dofwd(p,start,p->slen - start);
      doemit(p,0x44000000,0);
      dofwd(p,p->slen + -1,p->slen - (p->slen + -1));
      doemit(p,0x48000000,p->slen - (p->slen + -2));
      sVar1 = dupl(p,start + 1,finish_00 + 1);
      repeat(p,sVar1,1,to + -1);
      break;
    case 0xb:
      doinsert(p,0x24000000,(p->slen - start) + 1,start);
      doemit(p,0x28000000,p->slen - start);
      break;
    case 0x12:
      sVar1 = dupl(p,start,finish_00);
      repeat(p,sVar1,from + -1,to + -1);
      break;
    case 0x13:
      sVar1 = dupl(p,start,finish_00);
      repeat(p,sVar1,from + -1,to);
    }
  }
  return;
}

Assistant:

static void
repeat(p, start, from, to)
register struct parse *p;
sopno start;			/* operand from here to end of strip */
int from;			/* repeated from this number */
int to;				/* to this number of times (maybe INFINITY) */
{
	register sopno finish = HERE();
#	define	N	2
#	define	INF	3
#	define	REP(f, t)	((f)*8 + (t))
#	define	MAP(n)	(((n) <= 1) ? (n) : ((n) == INFINITY) ? INF : N)
	register sopno copy;

	if (p->error != 0)	/* head off possible runaway recursion */
		return;

	assert(from <= to);

	switch (REP(MAP(from), MAP(to))) {
	case REP(0, 0):			/* must be user doing this */
		DROP(finish-start);	/* drop the operand */
		break;
	case REP(0, 1):			/* as x{1,1}? */
	case REP(0, N):			/* as x{1,n}? */
	case REP(0, INF):		/* as x{1,}? */
		/* KLUDGE: emit y? as (y|) until subtle bug gets fixed */
		INSERT(OCH_, start);		/* offset is wrong... */
		repeat(p, start+1, 1, to);
		ASTERN(OOR1, start);
		AHEAD(start);			/* ... fix it */
		EMIT(OOR2, 0);
		AHEAD(THERE());
		ASTERN(O_CH, THERETHERE());
		break;
	case REP(1, 1):			/* trivial case */
		/* done */
		break;
	case REP(1, N):			/* as x?x{1,n-1} */
		/* KLUDGE: emit y? as (y|) until subtle bug gets fixed */
		INSERT(OCH_, start);
		ASTERN(OOR1, start);
		AHEAD(start);
		EMIT(OOR2, 0);			/* offset very wrong... */
		AHEAD(THERE());			/* ...so fix it */
		ASTERN(O_CH, THERETHERE());
		copy = dupl(p, start+1, finish+1);
		assert(copy == finish+4);
		repeat(p, copy, 1, to-1);
		break;
	case REP(1, INF):		/* as x+ */
		INSERT(OPLUS_, start);
		ASTERN(O_PLUS, start);
		break;
	case REP(N, N):			/* as xx{m-1,n-1} */
		copy = dupl(p, start, finish);
		repeat(p, copy, from-1, to-1);
		break;
	case REP(N, INF):		/* as xx{n-1,INF} */
		copy = dupl(p, start, finish);
		repeat(p, copy, from-1, to);
		break;
	default:			/* "can't happen" */
		SETERROR(REG_ASSERT);	/* just in case */
		break;
	}
}